

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O1

void pacf_mle(double *vec,int N,double *par,int M)

{
  ulong uVar1;
  double *phi;
  double *varcovar;
  ulong uVar2;
  double local_70;
  double var;
  double thetac;
  double *local_58;
  double local_50;
  double *local_48;
  double *local_40;
  int local_34;
  
  thetac = (double)par;
  local_58 = vec;
  local_34 = N;
  local_48 = (double *)malloc((long)N << 3);
  local_40 = (double *)malloc(0);
  local_50 = macheps();
  if (0 < M) {
    uVar2 = 0;
    do {
      uVar1 = uVar2 + 1;
      phi = (double *)malloc(uVar2 * 8 + 8);
      varcovar = (double *)malloc((uVar2 + 2) * (uVar2 + 2) * 8);
      nlalsm(local_58,local_34,(int)uVar1,0,0,phi,local_40,1,&var,&local_70,local_50,varcovar,
             local_48);
      *(double *)((long)thetac + uVar2 * 8) = phi[uVar2];
      free(phi);
      free(varcovar);
      uVar2 = uVar1;
    } while (uVar1 != (uint)M);
  }
  free(local_40);
  free(local_48);
  return;
}

Assistant:

void pacf_mle(double* vec, int N, double* par, int M) {
	// Using Box-Jenkins Conditional MLE
	double var, thetac, eps;
	double *phi, *theta, *varcovar, *res;
	int i, p, mean, k,ret;

	res = (double*)malloc(sizeof(double)* N);
	theta = (double*)malloc(sizeof(double)* 0);

	eps = macheps();
	mean = 1;

	for (i = 0; i < M; ++i) {
		p = i + 1;
		k = p + mean;
		phi = (double*)malloc(sizeof(double)* p);
		varcovar = (double*)malloc(sizeof(double)* k * k);
		ret = nlalsm(vec, N, p, 0, 0, phi, theta, mean, &thetac, &var, eps, varcovar, res);
		//ret = css(vec, N, 6, p, 0, 0, phi, theta, &thetac, &var, res, &loglik, varcovar);
		par[i] = phi[i];
		free(phi);
		free(varcovar);
	}

	free(theta);
	free(res);
}